

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_executor.cpp
# Opt level: O1

void __thiscall duckdb::ExpressionExecutor::AddExpression(ExpressionExecutor *this,Expression *expr)

{
  pointer *pppEVar1;
  iterator __position;
  ExpressionExecutorState *this_00;
  type state_00;
  pointer root_executor;
  pointer this_01;
  templated_unique_single_t state;
  _Head_base<0UL,_duckdb::ExpressionExecutorState_*,_false> local_20;
  
  __position._M_current =
       (this->expressions).
       super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
       super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_20._M_head_impl = (ExpressionExecutorState *)expr;
  if (__position._M_current ==
      (this->expressions).
      super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
      super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    ::std::vector<duckdb::Expression_const*,std::allocator<duckdb::Expression_const*>>::
    _M_realloc_insert<duckdb::Expression_const*>
              ((vector<duckdb::Expression_const*,std::allocator<duckdb::Expression_const*>> *)this,
               __position,(Expression **)&local_20);
  }
  else {
    *__position._M_current = expr;
    pppEVar1 = &(this->expressions).
                super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                .
                super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppEVar1 = *pppEVar1 + 1;
  }
  this_00 = (ExpressionExecutorState *)operator_new(0x10);
  ExpressionExecutorState::ExpressionExecutorState(this_00);
  local_20._M_head_impl = this_00;
  state_00 = unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>
             ::operator*((unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>
                          *)&local_20);
  Initialize(this,expr,state_00);
  root_executor =
       unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>
       ::operator->((unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>
                     *)&local_20);
  this_01 = unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>
            ::operator->(&root_executor->root_state);
  ExpressionState::Verify(this_01,root_executor);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,std::default_delete<duckdb::ExpressionExecutorState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,std::default_delete<duckdb::ExpressionExecutorState>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionExecutorState,std::default_delete<duckdb::ExpressionExecutorState>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,std::default_delete<duckdb::ExpressionExecutorState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,std::default_delete<duckdb::ExpressionExecutorState>,true>>>
              *)&this->states,
             (unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>
              *)&local_20);
  ::std::
  unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>_>
  ::~unique_ptr((unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>_>
                 *)&local_20);
  return;
}

Assistant:

void ExpressionExecutor::AddExpression(const Expression &expr) {
	expressions.push_back(&expr);
	auto state = make_uniq<ExpressionExecutorState>();
	Initialize(expr, *state);
	state->Verify();
	states.push_back(std::move(state));
}